

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::releaseKeyboard(QWidget *this)

{
  QWindow *pQVar1;
  QWidget *in_RDI;
  QWindow *window;
  QWidget *in_stack_fffffffffffffff0;
  
  if (keyboardGrb == in_RDI) {
    pQVar1 = grabberWindow(in_stack_fffffffffffffff0);
    if (pQVar1 != (QWindow *)0x0) {
      QWindow::setKeyboardGrabEnabled(SUB81(pQVar1,0));
    }
    keyboardGrb = (QWidget *)0x0;
  }
  return;
}

Assistant:

void QWidget::releaseKeyboard()
{
    if (keyboardGrb == this) {
        if (QWindow *window = grabberWindow(this))
            window->setKeyboardGrabEnabled(false);
        keyboardGrb = nullptr;
    }
}